

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::StringMaker<double,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<double,void> *this,double value)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ReusableStringStream rss;
  ReusableStringStream local_48;
  long *local_38 [2];
  long local_28 [2];
  
  if (NAN(value)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x6e616e;
    __return_storage_ptr__->_M_string_length = 3;
  }
  else {
    lVar4 = (long)precision;
    pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
    local_48.m_index = sVar2;
    pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    local_48.m_oss =
         (ostream *)
         (pSVar1->super_StringStreams).m_streams.
         super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar2].m_ptr;
    lVar3 = *(long *)local_48.m_oss;
    *(long *)((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_48.m_oss + *(long *)(lVar3 + -0x18) + 8) = lVar4;
    lVar3 = *(long *)(lVar3 + -0x18);
    *(uint *)((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_48.m_oss + lVar3 + 0x18) =
         *(uint *)((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48.m_oss + lVar3 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    lVar3 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
    if ((lVar3 != -1) && (lVar3 != __return_storage_ptr__->_M_string_length - 1)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    ReusableStringStream::~ReusableStringStream(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<double>::convert(double value) {
    return Detail::fpToString(value, precision);
}